

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

void __thiscall c4::yml::Parser::_free(Parser *this)

{
  size_t sVar1;
  
  if (this->m_newline_offsets != (size_t *)0x0) {
    (*(this->m_stack).m_callbacks.m_free)
              (this->m_newline_offsets,this->m_newline_offsets_capacity << 3,
               (this->m_stack).m_callbacks.m_user_data);
    this->m_newline_offsets_capacity = 0;
    (this->m_newline_offsets_buf).str = (char *)0x0;
    this->m_newline_offsets = (size_t *)0x0;
    this->m_newline_offsets_size = 0;
    (this->m_newline_offsets_buf).len = 0;
  }
  sVar1 = (this->m_filter_arena).len;
  if (sVar1 != 0) {
    (*(this->m_stack).m_callbacks.m_free)
              ((this->m_filter_arena).str,sVar1,(this->m_stack).m_callbacks.m_user_data);
    (this->m_filter_arena).str = (char *)0x0;
    (this->m_filter_arena).len = 0;
  }
  detail::stack<c4::yml::Parser::State,_16UL>::_free(&this->m_stack);
  return;
}

Assistant:

void Parser::_free()
{
    if(m_newline_offsets)
    {
        _RYML_CB_FREE(m_stack.m_callbacks, m_newline_offsets, size_t, m_newline_offsets_capacity);
        m_newline_offsets = nullptr;
        m_newline_offsets_size = 0u;
        m_newline_offsets_capacity = 0u;
        m_newline_offsets_buf = 0u;
    }
    if(m_filter_arena.len)
    {
        _RYML_CB_FREE(m_stack.m_callbacks, m_filter_arena.str, char, m_filter_arena.len);
        m_filter_arena = {};
    }
    m_stack._free();
}